

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O1

KDataStream * __thiscall KDIS::KDataStream::operator<<(KDataStream *this,KDataStream *val)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator __position;
  pointer __args;
  
  __args = (val->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (val->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args != puVar2) {
    do {
      __position._M_current =
           (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vBuffer,
                   __position,__args);
      }
      else {
        *__position._M_current = *__args;
        ppuVar1 = &(this->m_vBuffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      __args = __args + 1;
    } while (__args != puVar2);
  }
  return this;
}

Assistant:

KDataStream & KDataStream::operator << ( KDataStream val )
{
    vector<KUOCTET>::const_iterator citr = val.m_vBuffer.begin();
    vector<KUOCTET>::const_iterator citrEnd = val.m_vBuffer.end();

    // Copy data into the buffer OCTET by OCTET
    for( ; citr != citrEnd; ++citr )
    {
        m_vBuffer.push_back( *citr );
    }

    return *this;
}